

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O2

_Bool Curl_uint_spbset_next(uint_spbset *bset,uint last,uint *pnext)

{
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  long lVar5;
  curl_uint64_t *pcVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar7 = last + 1;
  uVar3 = uVar7 & 0xffffff00;
  while( true ) {
    if (bset == (uint_spbset *)0x0) {
      bset = (uint_spbset *)0x0;
      goto LAB_0015b49d;
    }
    if (uVar3 <= (uint)*(ulong *)((long)bset + 0x28)) break;
    bset = *(uint_spbset **)bset;
  }
  if ((uint)*(ulong *)((long)bset + 0x28) != uVar3) goto LAB_0015b49d;
  uVar8 = uVar7 >> 6 & 3;
  uVar9 = (ulong)uVar8;
  uVar10 = *(curl_uint64_t *)((long)bset + (uVar9 + 1) * 8) >> ((byte)uVar7 & 0x3f);
  if (uVar10 == 0) {
    iVar4 = uVar3 + uVar8 * 0x40;
    do {
      if (2 < uVar9) goto LAB_0015b497;
      uVar10 = *(curl_uint64_t *)((long)bset + (uVar9 + 2) * 8);
      uVar9 = uVar9 + 1;
      iVar4 = iVar4 + 0x40;
    } while (uVar10 == 0);
    lVar5 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
      }
    }
    uVar7 = (int)lVar5 + iVar4;
  }
  else {
    lVar5 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
      }
    }
    uVar7 = uVar7 + (int)lVar5;
  }
LAB_0015b4cb:
  _Var2 = true;
LAB_0015b4cd:
  *pnext = uVar7;
  return _Var2;
LAB_0015b497:
  *pnext = 0xffffffff;
  bset = *(uint_spbset **)bset;
LAB_0015b49d:
  if (bset != (uint_spbset *)0x0) {
    lVar5 = 0;
    pcVar6 = (curl_uint64_t *)bset;
LAB_0015b4a8:
    pcVar6 = pcVar6 + 1;
    if (lVar5 != -0x100) {
      uVar9 = *pcVar6;
      if (uVar9 == 0) goto code_r0x0015b4b8;
      lVar1 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar7 = ((int)lVar1 + (int)*(ulong *)((long)bset + 0x28)) - (int)lVar5;
      goto LAB_0015b4cb;
    }
    goto LAB_0015b497;
  }
  uVar7 = 0xffffffff;
  _Var2 = false;
  goto LAB_0015b4cd;
code_r0x0015b4b8:
  lVar5 = lVar5 + -0x40;
  goto LAB_0015b4a8;
}

Assistant:

bool Curl_uint_spbset_next(struct uint_spbset *bset, unsigned int last,
                           unsigned int *pnext)
{
  struct uint_spbset_chunk *chunk;
  unsigned int last_offset;

  ++last; /* look for the next higher number */
  last_offset = (last & ~CURL_UINT_SPBSET_CH_MASK);

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    if(chunk->offset >= last_offset) {
      break;
    }
  }

  if(chunk && (chunk->offset == last_offset)) {
    /* is there a number higher than last in this chunk? */
    if(uint_spbset_chunk_next(chunk, last, pnext))
      return TRUE;
    /* not in this chunk */
    chunk = chunk->next;
  }
  /* look for the first in the "higher" chunks, if there are any. */
  while(chunk) {
    if(uint_spbset_chunk_first(chunk, pnext))
      return TRUE;
    chunk = chunk->next;
  }
  *pnext = UINT_MAX;
  return FALSE;
}